

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::writeScene(Application *this,char *filename)

{
  ostream *poVar1;
  Application *this_00;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Writing scene to file ");
  poVar1 = std::operator<<(poVar1,filename);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (Application *)this->scene;
  Collada::ColladaWriter::writeScene((Scene *)this_00,filename);
  writeSkeleton(this_00,filename,this->scene);
  return;
}

Assistant:

void Application::writeScene( const char* filename )
{
   cerr << "Writing scene to file " << filename << endl;
   Collada::ColladaWriter::writeScene( *scene, filename );
   writeSkeleton(filename, scene);
}